

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

Descriptor * __thiscall
google::protobuf::DescriptorBuilder::OptionInterpreter::AggregateOptionFinder::FindAnyType
          (AggregateOptionFinder *this,Message *param_1,string *prefix,string *name)

{
  int iVar1;
  Symbol SVar2;
  Symbol SVar3;
  string_view name_00;
  
  iVar1 = std::__cxx11::string::compare((char *)prefix);
  if ((iVar1 != 0) && (iVar1 = std::__cxx11::string::compare((char *)prefix), iVar1 != 0)) {
    return (Descriptor *)0x0;
  }
  if (this->builder_->pool_->mutex_ != (Mutex *)0x0) {
    absl::lts_20240722::Mutex::AssertHeld();
  }
  name_00._M_str = (name->_M_dataplus)._M_p;
  name_00._M_len = name->_M_string_length;
  SVar2 = FindSymbol(this->builder_,name_00,true);
  SVar3.ptr_ = &((Descriptor *)0x0)->super_SymbolBase;
  if ((SVar2.ptr_)->symbol_type_ == '\x01') {
    SVar3 = SVar2;
  }
  return (Descriptor *)SVar3.ptr_;
}

Assistant:

const Descriptor* FindAnyType(const Message& /*message*/,
                                const std::string& prefix,
                                const std::string& name) const override {
    if (prefix != internal::kTypeGoogleApisComPrefix &&
        prefix != internal::kTypeGoogleProdComPrefix) {
      return nullptr;
    }
    assert_mutex_held(builder_->pool_);
    return builder_->FindSymbol(name).descriptor();
  }